

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall kj::HttpServer::listenHttp(HttpServer *this,ConnectionReceiver *port)

{
  undefined8 uVar1;
  undefined1 local_38 [16];
  SourceLocation local_28;
  
  listenLoop((HttpServer *)local_38,port);
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)(local_38 + 8));
  local_28.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_28.function = "listenHttp";
  local_28.lineNumber = 0x1fda;
  local_28.columnNumber = 10;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)this,(OwnPromiseNode *)local_38,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_38 + 8),&local_28);
  uVar1 = local_38._8_8_;
  if ((PromiseArenaMember *)local_38._8_8_ != (PromiseArenaMember *)0x0) {
    local_38._8_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  uVar1 = local_38._0_8_;
  if ((PromiseArenaMember *)local_38._0_8_ != (PromiseArenaMember *)0x0) {
    local_38._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServer::listenHttp(kj::ConnectionReceiver& port) {
  return listenLoop(port).exclusiveJoin(onDrain.addBranch());
}